

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ImGuiID IVar8;
  ImGuiContextHook *__dest;
  int iVar9;
  int iVar10;
  
  if (((*(long *)(hook + 0x10) == 0) || (*(int *)hook != 0)) || (*(int *)(hook + 4) == 7)) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xd22,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  iVar10 = (ctx->Hooks).Size;
  iVar3 = (ctx->Hooks).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar3 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      __dest = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar10 << 5,GImAllocatorUserData);
      pIVar4 = (ctx->Hooks).Data;
      if (pIVar4 != (ImGuiContextHook *)0x0) {
        memcpy(__dest,pIVar4,(long)(ctx->Hooks).Size << 5);
        pIVar4 = (ctx->Hooks).Data;
        if ((pIVar4 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (ctx->Hooks).Data = __dest;
      (ctx->Hooks).Capacity = iVar10;
    }
  }
  uVar5 = *(undefined8 *)(hook + 8);
  uVar6 = *(undefined8 *)(hook + 0x10);
  uVar7 = *(undefined8 *)(hook + 0x18);
  pIVar4 = (ctx->Hooks).Data + (long)(ctx->Hooks).Size * 0x20;
  *(undefined8 *)pIVar4 = *(undefined8 *)hook;
  *(undefined8 *)(pIVar4 + 8) = uVar5;
  *(undefined8 *)(pIVar4 + 0x10) = uVar6;
  *(undefined8 *)(pIVar4 + 0x18) = uVar7;
  iVar10 = (ctx->Hooks).Size;
  IVar8 = ctx->HookIdNext;
  uVar1 = iVar10 + 1;
  (ctx->Hooks).Size = uVar1;
  IVar8 = IVar8 + 1;
  ctx->HookIdNext = IVar8;
  if (-1 < iVar10) {
    *(ImGuiID *)((ctx->Hooks).Data + (ulong)uVar1 * 0x20 + -0x20) = IVar8;
    return IVar8;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x674,"T &ImVector<ImGuiContextHook>::back() [T = ImGuiContextHook]");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}